

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

char * __thiscall tinyxml2::XMLElement::ParseDeep(XMLElement *this,char *p,StrPair *strPair)

{
  char *pcVar1;
  
  pcVar1 = XMLUtil::SkipWhiteSpace(p);
  if (*pcVar1 == '/') {
    this->_closingType = 2;
    pcVar1 = pcVar1 + 1;
  }
  pcVar1 = StrPair::ParseName(&(this->super_XMLNode)._value,pcVar1);
  if (((this->super_XMLNode)._value._start == (this->super_XMLNode)._value._end) ||
     (pcVar1 = ParseAttributes(this,pcVar1), pcVar1 == (char *)0x0)) {
    return (char *)0x0;
  }
  if (*pcVar1 == '\0') {
    return pcVar1;
  }
  if (this->_closingType != 0) {
    return pcVar1;
  }
  pcVar1 = XMLNode::ParseDeep(&this->super_XMLNode,pcVar1,strPair);
  return pcVar1;
}

Assistant:

char* XMLElement::ParseDeep( char* p, StrPair* strPair )
{
    // Read the element name.
    p = XMLUtil::SkipWhiteSpace( p );

    // The closing element is the </element> form. It is
    // parsed just like a regular element then deleted from
    // the DOM.
    if ( *p == '/' ) {
        _closingType = CLOSING;
        ++p;
    }

    p = _value.ParseName( p );
    if ( _value.Empty() ) {
        return 0;
    }

    p = ParseAttributes( p );
    if ( !p || !*p || _closingType ) {
        return p;
    }

    p = XMLNode::ParseDeep( p, strPair );
    return p;
}